

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

bool_t Node_Notify(node *Node,dataid Id)

{
  nodecontext *p;
  void *pvVar1;
  nodedata *pnVar2;
  nodenotify *pnVar3;
  bool bVar4;
  bool bVar5;
  nodedata **i;
  dataid Id_local;
  node *Node_local;
  bool_t PosDeleteList;
  bool_t PostDeleteNode;
  nodenotify *m;
  nodenotify *n;
  nodeevt Pin;
  nodenotify *Top;
  nodeclass *Class;
  nodedata **local_40;
  
  local_40 = Node_GetDataStart(Node,Id,0xe);
  if ((local_40 == (nodedata **)0x0) || (*local_40 == (nodedata *)0xfffffffffffffff0)) {
    Node_local = (node *)0x0;
  }
  else {
    if (Node == (node *)0x0) {
      __assert_fail("(const void*)(Node)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x6f3,"bool_t Node_Notify(node *, dataid)");
    }
    p = *Node->VMT;
    pvVar1 = Node->VMT;
    pnVar2 = *local_40;
    Pin.Id = (dataid)(pnVar2 + 1);
    bVar4 = false;
    bVar5 = false;
    if (pnVar2[1].Code == 0) {
      pnVar2[1].Code = Pin.Id;
      pnVar3 = (nodenotify *)((nodedata *)Pin.Id)->Next;
      n = (nodenotify *)Node;
      Pin.Node = (node *)Id;
      if ((nodenotify *)((nodedata *)Pin.Id)->Next == (nodenotify *)0x0) {
        __assert_fail("n!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x6c6,"void Node_NotifyInternal(node *, dataid, nodedata **, nodecontext *)")
        ;
      }
      while (m = pnVar3, m != (nodenotify *)0x0) {
        *(nodenotify **)(Pin.Id + 0x10) = m;
        (*m->Func)(m->Referer,(nodeevt *)&n);
        pnVar3 = m->Next;
        if (*(long *)(Pin.Id + 0x10) == Pin.Id + 0x10) {
          bVar4 = true;
        }
        else if (*(dataid *)(Pin.Id + 0x10) == Pin.Id) {
          bVar5 = true;
        }
        else if (*(long *)(Pin.Id + 0x10) == 0) {
          (*p->NodeHeap->Free)(p->NodeHeap,m,0x18);
          local_40 = Node_GetDataStart(Node,Id,0xe);
        }
      }
      *(undefined8 *)(Pin.Id + 0x10) = 0;
      if (bVar4) {
        DataFree(p,Node,local_40,1);
        EraseNode(p,Node,(nodeclass *)((long)pvVar1 + -0x48));
      }
      else if (((Id == 0xb) || (*(long *)Pin.Id == 0)) || (bVar5)) {
        DataFree(p,Node,local_40,0);
      }
      *(undefined8 *)(Pin.Id + 8) = 0;
    }
    else if (pnVar2[1].Code == 0) {
      __assert_fail("Top->Func!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x6bd,"void Node_NotifyInternal(node *, dataid, nodedata **, nodecontext *)");
    }
    Node_local = (node *)0x1;
  }
  return (bool_t)Node_local;
}

Assistant:

bool_t Node_Notify(node* Node,dataid Id)
{
    nodedata** i = Node_GetDataStart(Node,Id,TYPE_NODENOTIFY);
    if (i && NodeData_Data(*i))
    {
        Node_NotifyInternal(Node,Id,i,Node_Context(Node));
        return 1;
    }
    return 0;
}